

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O1

int Cudd_zddPrintMinterm(DdManager *zdd,DdNode *node)

{
  int iVar1;
  int *list;
  long lVar2;
  
  iVar1 = zdd->sizeZ;
  list = (int *)malloc((long)iVar1 * 4);
  if (list == (int *)0x0) {
    zdd->errorCode = CUDD_MEMORY_OUT;
    iVar1 = 0;
  }
  else {
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        list[lVar2] = 3;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    zdd_print_minterm_aux(zdd,node,0,list);
    free(list);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
Cudd_zddPrintMinterm(
  DdManager * zdd,
  DdNode * node)
{
    int         i, size;
    int         *list;

    size = (int)zdd->sizeZ;
    list = ABC_ALLOC(int, size);
    if (list == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < size; i++) list[i] = 3; /* bogus value should disappear */
    zdd_print_minterm_aux(zdd, node, 0, list);
    ABC_FREE(list);
    return(1);

}